

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Const * kratos::Const::constant
                  (string *hex_value,uint32_t num_bits,bool negative,uint32_t width,bool is_signed)

{
  long lVar1;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint32_t local_3c;
  Const *pCStack_38;
  uint32_t width_local;
  shared_ptr<kratos::Const> p;
  bool is_signed_local;
  
  local_60._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  local_3c = width;
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  std::make_shared<kratos::Const,unsigned_long,unsigned_int&,bool&>
            ((unsigned_long *)&stack0xffffffffffffffc8,(uint *)&local_60,(bool *)&local_3c);
  lVar1 = std::__cxx11::string::find_first_not_of((char *)hex_value,0x21ecad);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)&pCStack_38->hex_value_);
    pCStack_38->negative_ = negative;
    pCStack_38->num_bits_ = num_bits;
    std::
    _Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<std::shared_ptr<kratos::Const>&>
              ((_Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&consts_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    return pCStack_38;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Invalid hex value for constant ",hex_value);
  std::invalid_argument::invalid_argument(this,(string *)&local_60);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Const &Const::constant(const std::string &hex_value, uint32_t num_bits, bool negative,
                       uint32_t width, bool is_signed) {
    auto p = std::make_shared<Const>(std::numeric_limits<uint64_t>::max(), width, is_signed);
    if (hex_value.find_first_not_of("abcdefABCDEF0123456789") != std::string::npos) {
        throw std::invalid_argument("Invalid hex value for constant " + hex_value);
    }
    p->hex_value_ = hex_value;
    p->negative_ = negative;
    p->num_bits_ = num_bits;
    consts_.emplace(p);
    return *p;
}